

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O3

CPpmd_Void_Ref CutOff(CPpmd8 *p,CTX_PTR ctx,uint order)

{
  byte bVar1;
  byte bVar2;
  undefined4 uVar3;
  Byte *pBVar4;
  ulong uVar5;
  long lVar6;
  CTX_PTR pCVar7;
  undefined2 uVar8;
  byte *pbVar9;
  uint uVar10;
  int iVar12;
  CPpmd_Void_Ref CVar13;
  int iVar14;
  Byte *pBVar15;
  ulong uVar16;
  uint oldNU;
  byte *pbVar17;
  uint uVar18;
  ulong uVar19;
  Byte *pBVar11;
  
  bVar1 = ctx->NumStats;
  uVar19 = (ulong)bVar1;
  pBVar15 = p->Base;
  iVar12 = (int)ctx;
  if (bVar1 == 0) {
    pCVar7 = (CTX_PTR)p->UnitsStart;
    if (pCVar7 <= (CTX_PTR)(pBVar15 + ctx->Stats)) {
      if (order < p->MaxOrder) {
        CVar13 = CutOff(p,(CTX_PTR)(pBVar15 + ctx->Stats),order + 1);
        uVar8 = (undefined2)(CVar13 >> 0x10);
      }
      else {
        CVar13 = 0;
        uVar8 = 0;
      }
      *(short *)&ctx->Stats = (short)CVar13;
      *(undefined2 *)((long)&ctx->Stats + 2) = uVar8;
      if ((order < 10) || (ctx->Stats != 0)) {
        return iVar12 - *(int *)&p->Base;
      }
      pCVar7 = (CTX_PTR)p->UnitsStart;
    }
    if (pCVar7 == ctx) {
LAB_0028e81e:
      p->UnitsStart = &pCVar7[1].NumStats;
    }
    else {
      ctx->NumStats = 0xff;
      ctx->Flags = 0xff;
      ctx->SummFreq = 0xffff;
      ctx->Stats = p->FreeList[0];
      ctx->Suffix = (uint)p->Indx2Units[0];
      iVar14 = *(int *)&p->Base;
LAB_0028e80e:
      p->FreeList[0] = iVar12 - iVar14;
      p->Stamps[0] = p->Stamps[0] + 1;
    }
    CVar13 = 0;
  }
  else {
    uVar10 = ctx->Stats;
    uVar5 = (ulong)uVar10;
    pBVar11 = pBVar15 + uVar5;
    oldNU = bVar1 + 2 >> 1;
    pBVar4 = p->UnitsStart;
    if (pBVar11 <= pBVar4 + 0x4000) {
      bVar2 = p->Units2Indx[oldNU - 1];
      uVar16 = (ulong)p->FreeList[bVar2];
      if (uVar10 <= p->FreeList[bVar2]) {
        p->FreeList[bVar2] = *(CPpmd_Void_Ref *)(pBVar15 + uVar16 + 4);
        p->Stamps[bVar2] = p->Stamps[bVar2] - 1;
        lVar6 = 0;
        do {
          *(undefined4 *)(pBVar15 + lVar6 + uVar16) = *(undefined4 *)(pBVar15 + lVar6 + uVar5);
          *(undefined4 *)(pBVar15 + lVar6 + uVar16 + 4) =
               *(undefined4 *)(pBVar15 + lVar6 + uVar5 + 4);
          *(undefined4 *)(pBVar15 + lVar6 + uVar16 + 8) =
               *(undefined4 *)(pBVar15 + lVar6 + uVar5 + 8);
          lVar6 = lVar6 + 0xc;
        } while (((uint)bVar1 * 2 + 4 & 0xfffffffc) * 3 != (int)lVar6);
        if (pBVar4 == pBVar11) {
          p->UnitsStart = pBVar4 + (ulong)p->Indx2Units[bVar2] * 0xc;
          pBVar11 = pBVar15 + uVar16;
        }
        else {
          pBVar11[0] = 0xff;
          pBVar11[1] = 0xff;
          pBVar11[2] = 0xff;
          pBVar11[3] = 0xff;
          *(CPpmd_Void_Ref *)(pBVar11 + 4) = p->FreeList[bVar2];
          *(uint *)(pBVar11 + 8) = (uint)p->Indx2Units[bVar2];
          p->FreeList[bVar2] = uVar10;
          p->Stamps[bVar2] = p->Stamps[bVar2] + 1;
          pBVar11 = pBVar15 + uVar16;
        }
      }
    }
    uVar10 = (int)pBVar11 - (int)pBVar15;
    ctx->Stats = uVar10;
    pbVar9 = pBVar15 + uVar10;
    pbVar17 = pbVar9 + uVar19 * 6;
    do {
      if ((CTX_PTR)(pBVar15 + *(uint *)(pbVar17 + 2)) < (CTX_PTR)p->UnitsStart) {
        lVar6 = (long)(int)uVar19;
        uVar19 = (ulong)((int)uVar19 - 1);
        pbVar17[2] = 0;
        pbVar17[3] = 0;
        pbVar17[4] = 0;
        pbVar17[5] = 0;
        uVar8 = *(undefined2 *)(pbVar17 + 4);
        uVar3 = *(undefined4 *)pbVar17;
        *(undefined2 *)(pbVar17 + 4) = *(undefined2 *)(pbVar9 + lVar6 * 6 + 4);
        *(undefined4 *)pbVar17 = *(undefined4 *)(pbVar9 + lVar6 * 6);
        *(undefined2 *)(pbVar9 + lVar6 * 6 + 4) = uVar8;
        *(undefined4 *)(pbVar9 + lVar6 * 6) = uVar3;
      }
      else if (order < p->MaxOrder) {
        CVar13 = CutOff(p,(CTX_PTR)(pBVar15 + *(uint *)(pbVar17 + 2)),order + 1);
        *(CPpmd_Void_Ref *)(pbVar17 + 2) = CVar13;
      }
      else {
        pbVar17[2] = 0;
        pbVar17[3] = 0;
        pbVar17[4] = 0;
        pbVar17[5] = 0;
      }
      pbVar17 = pbVar17 + -6;
      pBVar15 = p->Base;
      uVar10 = ctx->Stats;
      pbVar9 = pBVar15 + uVar10;
    } while (pbVar9 <= pbVar17);
    if ((order != 0) && (uVar18 = (uint)uVar19, uVar18 != ctx->NumStats)) {
      ctx->NumStats = (Byte)uVar19;
      if ((int)uVar18 < 0) {
        bVar1 = p->Units2Indx[oldNU - 1];
        pbVar9[0] = 0xff;
        pbVar9[1] = 0xff;
        pbVar9[2] = 0xff;
        pbVar9[3] = 0xff;
        *(CPpmd_Void_Ref *)(pbVar9 + 4) = p->FreeList[bVar1];
        *(uint *)(pbVar9 + 8) = (uint)p->Indx2Units[bVar1];
        p->FreeList[bVar1] = uVar10;
        p->Stamps[bVar1] = p->Stamps[bVar1] + 1;
        pCVar7 = (CTX_PTR)p->UnitsStart;
        if (pCVar7 == ctx) goto LAB_0028e81e;
        ctx->NumStats = 0xff;
        ctx->Flags = 0xff;
        ctx->SummFreq = 0xffff;
        ctx->Stats = p->FreeList[0];
        ctx->Suffix = (uint)p->Indx2Units[0];
        iVar14 = (int)pBVar15;
        goto LAB_0028e80e;
      }
      if (uVar18 == 0) {
        ctx->Flags = (0x3f < *pbVar9) << 3 | ctx->Flags & 0x10;
        *(undefined4 *)&ctx->SummFreq = *(undefined4 *)pbVar9;
        *(undefined2 *)((long)&ctx->Stats + 2) = *(undefined2 *)(pbVar9 + 4);
        bVar1 = p->Units2Indx[oldNU - 1];
        pbVar9[0] = 0xff;
        pbVar9[1] = 0xff;
        pbVar9[2] = 0xff;
        pbVar9[3] = 0xff;
        *(CPpmd_Void_Ref *)(pbVar9 + 4) = p->FreeList[bVar1];
        *(uint *)(pbVar9 + 8) = (uint)p->Indx2Units[bVar1];
        pBVar15 = p->Base;
        p->FreeList[bVar1] = (int)pbVar9 - (int)pBVar15;
        p->Stamps[bVar1] = p->Stamps[bVar1] + 1;
        *(char *)((long)&ctx->SummFreq + 1) = (char)(*(byte *)((long)&ctx->SummFreq + 1) + 0xb >> 3)
        ;
      }
      else {
        Refresh(p,ctx,oldNU,(uint)((int)(uVar18 * 0x10) < (int)(uint)ctx->SummFreq));
        pBVar15 = p->Base;
      }
    }
    CVar13 = iVar12 - (int)pBVar15;
  }
  return CVar13;
}

Assistant:

static CPpmd_Void_Ref CutOff(CPpmd8 *p, CTX_PTR ctx, unsigned order)
{
  int i;
  unsigned tmp;
  CPpmd_State *s;
  
  if (!ctx->NumStats)
  {
    s = ONE_STATE(ctx);
    if ((Byte *)Ppmd8_GetPtr(p, SUCCESSOR(s)) >= p->UnitsStart)
    {
      if (order < p->MaxOrder)
        SetSuccessor(s, CutOff(p, CTX(SUCCESSOR(s)), order + 1));
      else
        SetSuccessor(s, 0);
      if (SUCCESSOR(s) || order <= 9) /* O_BOUND */
        return REF(ctx);
    }
    SpecialFreeUnit(p, ctx);
    return 0;
  }

  ctx->Stats = STATS_REF(MoveUnitsUp(p, STATS(ctx), tmp = ((unsigned)ctx->NumStats + 2) >> 1));

  for (s = STATS(ctx) + (i = ctx->NumStats); s >= STATS(ctx); s--)
    if ((Byte *)Ppmd8_GetPtr(p, SUCCESSOR(s)) < p->UnitsStart)
    {
      CPpmd_State *s2 = STATS(ctx) + (i--);
      SetSuccessor(s, 0);
      SwapStates(s, s2);
    }
    else if (order < p->MaxOrder)
      SetSuccessor(s, CutOff(p, CTX(SUCCESSOR(s)), order + 1));
    else
      SetSuccessor(s, 0);
    
  if (i != ctx->NumStats && order)
  {
    ctx->NumStats = (Byte)i;
    s = STATS(ctx);
    if (i < 0)
    {
      FreeUnits(p, s, tmp);
      SpecialFreeUnit(p, ctx);
      return 0;
    }
    if (i == 0)
    {
      ctx->Flags = (Byte)((ctx->Flags & 0x10) + 0x08 * (s->Symbol >= 0x40));
      *ONE_STATE(ctx) = *s;
      FreeUnits(p, s, tmp);
      /* 9.31: the code was fixed. It's was not BUG, if Freq <= MAX_FREQ = 124 */
      ONE_STATE(ctx)->Freq = (Byte)(((unsigned)ONE_STATE(ctx)->Freq + 11) >> 3);
    }
    else
      Refresh(p, ctx, tmp, ctx->SummFreq > 16 * i);
  }
  return REF(ctx);
}